

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Page * page_merge_hot(Page *pA,Page *pB)

{
  Page *local_88;
  Page *pTail;
  Page result;
  Page *pB_local;
  Page *pA_local;
  
  result.pNextHot = (Page *)0x0;
  local_88 = (Page *)&pTail;
  result.pPrevHot = pB;
  pB_local = pA;
  while (pB_local != (Page *)0x0 && result.pPrevHot != (Page *)0x0) {
    if (pB_local->pgno < (result.pPrevHot)->pgno) {
      local_88->pPrevHot = pB_local;
      pB_local->pNextHot = local_88;
      local_88 = pB_local;
      pB_local = pB_local->pPrevHot;
    }
    else {
      local_88->pPrevHot = result.pPrevHot;
      (result.pPrevHot)->pNextHot = local_88;
      local_88 = result.pPrevHot;
      result.pPrevHot = (result.pPrevHot)->pPrevHot;
    }
  }
  if (pB_local == (Page *)0x0) {
    if (result.pPrevHot == (Page *)0x0) {
      local_88->pNextHot = (Page *)0x0;
      local_88->pPrevHot = (Page *)0x0;
    }
    else {
      local_88->pPrevHot = result.pPrevHot;
      (result.pPrevHot)->pNextHot = local_88;
    }
  }
  else {
    local_88->pPrevHot = pB_local;
    pB_local->pNextHot = local_88;
  }
  return result.pNextHot;
}

Assistant:

static Page * page_merge_hot(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pNextHot = result.pPrevHot = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pPrevHot = pA;
			pA->pNextHot = pTail;
			pTail = pA;
			pA = pA->pPrevHot;
		}else{
			pTail->pPrevHot = pB;
			pB->pNextHot = pTail;
			pTail = pB;
			pB = pB->pPrevHot;
		}
	}
	if( pA ){
		pTail->pPrevHot = pA;
		pA->pNextHot = pTail;
	}else if( pB ){
		pTail->pPrevHot = pB;
		pB->pNextHot = pTail;
	}else{
		pTail->pPrevHot = pTail->pNextHot = 0;
	}
	return result.pPrevHot;
}